

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_validate.c
# Opt level: O0

int cfg_validate_acl(autobuf *out,char *section_name,char *entry_name,char *value,_Bool prefix,
                    int8_t *af_types,size_t af_types_count)

{
  int iVar1;
  undefined1 local_68 [8];
  netaddr_acl dummy;
  int8_t *af_types_local;
  _Bool prefix_local;
  char *value_local;
  char *entry_name_local;
  char *section_name_local;
  autobuf *out_local;
  
  dummy._32_8_ = af_types;
  iVar1 = netaddr_acl_handle_keywords((netaddr_acl *)local_68,value);
  if (iVar1 == 0) {
    out_local._4_4_ = 0;
  }
  else if ((*value == '+') || (*value == '-')) {
    out_local._4_4_ =
         cfg_validate_netaddr
                   (out,section_name,entry_name,value + 1,prefix,(int8_t *)dummy._32_8_,
                    af_types_count);
  }
  else {
    out_local._4_4_ =
         cfg_validate_netaddr
                   (out,section_name,entry_name,value,prefix,(int8_t *)dummy._32_8_,af_types_count);
  }
  return out_local._4_4_;
}

Assistant:

int
cfg_validate_acl(struct autobuf *out, const char *section_name, const char *entry_name, const char *value, bool prefix,
  const int8_t *af_types, size_t af_types_count) {
  struct netaddr_acl dummy;

  if (netaddr_acl_handle_keywords(&dummy, value) == 0) {
    return 0;
  }

  if (*value == '+' || *value == '-') {
    return cfg_validate_netaddr(out, section_name, entry_name, &value[1], prefix, af_types, af_types_count);
  }

  return cfg_validate_netaddr(out, section_name, entry_name, value, prefix, af_types, af_types_count);
}